

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

vm_val_t * __thiscall ListArgs::get(ListArgs *this,vm_val_t *val)

{
  int idx;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  
  idx = this->idx;
  if (idx == 1 && this->len < 0) {
    uVar2 = *(undefined4 *)&(this->lst).field_0x4;
    aVar1 = (this->lst).val;
    val->typ = (this->lst).typ;
    *(undefined4 *)&val->field_0x4 = uVar2;
    val->val = aVar1;
  }
  else if (this->len < idx) {
    val->typ = VM_NIL;
  }
  else {
    vm_val_t::ll_index(&this->lst,val,idx);
  }
  return val;
}

Assistant:

virtual vm_val_t *get(vm_val_t *val)
    {
        if (len < 0 && idx == 1)
        {
            /* 
             *   we don't have a list, so pretend the value was wrapped in a
             *   single-element list by returning it at index 1
             */
            *val = lst;
        }
        else if (idx <= len)
        {
            /* we have a valid list and a valid index - get the element */
            VMGLOB_PTR(vmg);
            lst.ll_index(vmg_ val, idx);
        }
        else
        {
            /* we're past the end of the list - return nil */
            val->set_nil();
        }
        return val;
    }